

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::postProcess(Field<OpenMD::Vector3<double>_> *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  uint k;
  uint j;
  uint i;
  double in_stack_ffffffffffffffb8;
  Vector<double,_3U> *this_00;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
            ::size((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                    *)(in_RDI + 0x758));
    if (sVar1 <= local_c) break;
    local_10 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                             *)(in_RDI + 0x758),(ulong)local_c);
      sVar1 = std::
              vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= local_10) break;
      local_14 = 0;
      while( true ) {
        pvVar2 = std::
                 vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                               *)(in_RDI + 0x758),(ulong)local_c);
        pvVar3 = std::
                 vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                 ::operator[](pvVar2,(ulong)local_10);
        sVar1 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                size(pvVar3);
        if (sVar1 <= local_14) break;
        pvVar4 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                               *)(in_RDI + 0x740),(ulong)local_c);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar4,(ulong)local_10);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_14);
        if (0.0 < *pvVar6) {
          pvVar4 = std::
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 *)(in_RDI + 0x740),(ulong)local_c);
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](pvVar4,(ulong)local_10);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_14);
          this_00 = (Vector<double,_3U> *)*pvVar6;
          pvVar2 = std::
                   vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                 *)(in_RDI + 0x758),(ulong)local_c);
          pvVar3 = std::
                   vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                   ::operator[](pvVar2,(ulong)local_10);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](pvVar3,(ulong)local_14);
          Vector<double,_3U>::operator/=(this_00,in_stack_ffffffffffffffb8);
        }
        local_14 = local_14 + 1;
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Field<T>::postProcess() {
    for (unsigned int i = 0; i < field_.size(); ++i) {
      for (unsigned int j = 0; j < field_[i].size(); ++j) {
        for (unsigned int k = 0; k < field_[i][j].size(); ++k) {
          if (dens_[i][j][k] > 0.0) { field_[i][j][k] /= dens_[i][j][k]; }
        }
      }
    }
  }